

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# C++20Support.hpp
# Opt level: O1

string * std::format<char_const*>(string *__return_storage_ptr__,string_view fmt,char **ts)

{
  char *pcVar1;
  ostream *poVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  ulong uVar10;
  long lVar11;
  stringstream ss;
  long alStack_3b8 [2];
  char *local_3a8;
  long alStack_3a0 [62];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  pcVar6 = fmt._M_str;
  sVar9 = fmt._M_len;
  uVar10 = 0;
  memset(alStack_3b8 + 1,0,0x200);
  pcVar1 = pcVar6 + sVar9;
  pcVar5 = pcVar6;
  if (sVar9 != 0) {
    uVar10 = 0;
    pcVar4 = pcVar6;
    pcVar7 = pcVar6;
    pcVar8 = pcVar6;
    do {
      pcVar5 = pcVar8;
      if ((*pcVar8 != '}') && (pcVar5 = pcVar4, *pcVar8 == '{')) {
        if (pcVar4 == pcVar6) {
          alStack_3b8[uVar10 * 2 + 1] = (long)pcVar7 - (long)pcVar4;
          (&local_3a8)[uVar10 * 2] = pcVar4;
          uVar10 = uVar10 + 1;
        }
        else if (uVar10 < 0x20 && pcVar8 != pcVar4) {
          alStack_3b8[uVar10 * 2 + 1] = (long)(pcVar7 + ~(ulong)pcVar4);
          (&local_3a8)[uVar10 * 2] = pcVar4 + 1;
          uVar10 = uVar10 + 1;
        }
      }
      pcVar8 = pcVar8 + 1;
      pcVar7 = pcVar7 + 1;
      sVar9 = sVar9 - 1;
      pcVar4 = pcVar5;
    } while (sVar9 != 0);
  }
  pcVar5 = pcVar5 + 1;
  if (pcVar5 != pcVar1) {
    alStack_3b8[uVar10 * 2 + 1] = (long)pcVar1 - (long)pcVar5;
    (&local_3a8)[uVar10 * 2] = pcVar5;
  }
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(local_1a0,local_3a8,alStack_3b8[1]);
  pcVar1 = *ts;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar3 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar1,sVar3);
  }
  for (lVar11 = 0x18; lVar11 != 0x208; lVar11 = lVar11 + 0x10) {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,*(char **)((long)alStack_3b8 + lVar11 + 8U),
               *(long *)((long)alStack_3b8 + lVar11));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

string format(std::string_view fmt, auto&&... ts) {
    if (sizeof...(ts) == 0) return std::string(fmt);
    std::array<std::string_view, 32> fragments{};
    if (sizeof...(ts) > fragments.size()) throw std::length_error("format parameters count limit exceeded");
    size_t index = 0;
    auto start = fmt.cbegin(), parser = start;
    while (parser != fmt.cend()) {
        if (*parser == '{') {
            if (start == fmt.cbegin())
                fragments[index++] = std::string_view(start, static_cast<size_t>(parser - start));          /// string_view constructor with iterators is missing in Apple Clang 13
            else if (start != parser && index < fragments.size())
                fragments[index++] = std::string_view(start + 1, static_cast<size_t>(parser - (start + 1)));/// string_view constructor with iterators is missing in Apple Clang 13
        }
        else if (*parser == '}')
            start = parser;
        ++parser;
    }
    if (start + 1 != fmt.cend()) fragments[index++] = std::string_view(start + 1, static_cast<size_t>(fmt.cend() - (start + 1)));/// string_view constructor with iterators is missing in Apple Clang 13

    auto frag = fragments.cbegin();
    stringstream ss;
    using webfront::operator<<;
    ((ss << *frag++ << std::forward<decltype(ts)>(ts)), ...);
    while (frag != fragments.cend()) ss << *frag++;
    return ss.str();
}